

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* pstore::path::win32::split_drive
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  size_type sVar5;
  string normp;
  _Alloc_hider local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  char *local_70;
  ulong local_68;
  char local_60;
  undefined7 uStack_5f;
  _Alloc_hider local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  if (path->_M_string_length < 2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x180d7e,path);
    return __return_storage_ptr__;
  }
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  std::__cxx11::string::reserve((ulong)&local_70);
  sVar2 = path->_M_string_length;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      std::__cxx11::string::push_back((char)&local_70);
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  if ((((local_68 < 3) || (*local_70 != '/')) || (local_68 == 3)) ||
     ((local_70[1] != '/' || (local_70[2] == '/')))) {
    if ((local_68 < 2) || (local_70[1] != ':')) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x180d7e,path);
      goto LAB_0017bb27;
    }
    std::__cxx11::string::substr((ulong)&local_90,(ulong)path);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
  }
  else {
    lVar3 = std::__cxx11::string::find((char)&local_70,0x2f);
    if (lVar3 == -1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x180d7e,path);
      goto LAB_0017bb27;
    }
    lVar4 = std::__cxx11::string::find((char)&local_70,0x2f);
    if (lVar4 == lVar3 + 1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x180d7e,path);
      goto LAB_0017bb27;
    }
    std::__cxx11::string::substr((ulong)&local_90,(ulong)path);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
  }
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if (local_90._M_p == &local_80) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_78;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_90._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
  }
  (__return_storage_ptr__->first)._M_string_length = local_88;
  local_88 = 0;
  local_80 = '\0';
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if ((size_type *)local_50._M_p == &local_40) {
    paVar1->_M_allocated_capacity = local_40;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_38;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_50._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_40;
  }
  (__return_storage_ptr__->second)._M_string_length = local_48;
  local_90._M_p = &local_80;
LAB_0017bb27:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> split_drive (std::string const & path) {
                if (path.length () <= 1) {
                    return {"", path};
                }

                // Normalize the slash direction.
                std::string normp;
                normp.reserve (path.length ());
                std::transform (std::begin (path), std::end (path), std::back_inserter (normp),
                                [] (char const c) { return c == '\\' ? '/' : c; });

                if ((normp.length () > 2 && normp[0] == '/' && normp[1] == '/') &&
                    (normp.length () > 3 && normp[2] != '/')) {
                    // This is is a UNC path:
                    // vvvvvvvvvvvvvvvvvvvv drive letter or UNC path
                    // \\machine\mountpoint\directory\etc\...
                    //           directory ^^^^^^^^^^^^^^^
                    std::string::size_type const index = normp.find ('/', 2);
                    if (index == std::string::npos) {
                        return {"", path};
                    }

                    std::string::size_type index2 = normp.find ('/', index + 1);
                    // An UNC path can't have two slashes in a row (after the initial two)
                    if (index2 == index + 1) {
                        return {"", path};
                    }
                    if (index2 == std::string::npos) {
                        index2 = path.length ();
                    }
                    return {path.substr (0, index2), path.substr (index2, std::string::npos)};
                }
                if (normp.length () > 1 && normp[1] == ':') {
                    return {path.substr (0, 2), path.substr (2, std::string::npos)};
                }
                return {"", path};
            }